

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

iterator __thiscall Json::Value::end(Value *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  long *in_RSI;
  iterator iVar2;
  iterator local_20 [2];
  Value *this_local;
  
  this_local = this;
  if (((char)in_RSI[1] == '\x06' || (char)in_RSI[1] == '\a') && (*in_RSI != 0)) {
    local_20[0] = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                         *)*in_RSI);
    ValueIterator::ValueIterator((ValueIterator *)this,local_20);
    uVar1 = extraout_RDX;
  }
  else {
    ValueIterator::ValueIterator((ValueIterator *)this);
    uVar1 = extraout_RDX_00;
  }
  iVar2.super_ValueIteratorBase._8_8_ = uVar1;
  iVar2.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this;
  return (iterator)iVar2.super_ValueIteratorBase;
}

Assistant:

Value::iterator 
Value::end()
{
   switch ( type_ )
   {
#ifdef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
      if ( value_.array_ )
      {
         ValueInternalArray::IteratorState it;
         value_.array_->makeEndIterator( it );
         return iterator( it );
      }
      break;
   case objectValue:
      if ( value_.map_ )
      {
         ValueInternalMap::IteratorState it;
         value_.map_->makeEndIterator( it );
         return iterator( it );
      }
      break;
#else
   case arrayValue:
   case objectValue:
      if ( value_.map_ )
         return iterator( value_.map_->end() );
      break;
#endif
   default:
      break;
   }
   return iterator();
}